

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O3

uchar __thiscall node_t::first_byte_at(node_t *this,size_t index_)

{
  uchar *in_RAX;
  uchar *puVar1;
  
  puVar1 = this->_data;
  if (*(uint *)(this->_data + 8) <= index_) {
    first_byte_at();
    puVar1 = in_RAX;
  }
  return puVar1[index_ + 0xc + (ulong)*(uint *)(puVar1 + 4)];
}

Assistant:

unsigned char node_t::first_byte_at (size_t index_)
{
    zmq_assert (index_ < edgecount ());
    return first_bytes ()[index_];
}